

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

IterationResult __thiscall
helics::FederateState::enterInitializingMode(FederateState *this,IterationRequest request)

{
  __atomic_flag_data_type _Var1;
  FederateStates FVar2;
  IterationResult IVar3;
  
  while( true ) {
    LOCK();
    _Var1 = (this->processing).super___atomic_flag_base._M_i;
    (this->processing).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) {
      IVar3 = processQueue(this);
      LOCK();
      (this->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
      LOCK();
      (this->initIterating)._M_base._M_i = false;
      UNLOCK();
      if (IVar3 == NEXT_STEP) {
        (this->time_granted).internalTimeCode = -1000000000000000;
        (this->allowed_send_time).internalTimeCode = -1000000000000000;
        IVar3 = NEXT_STEP;
      }
      return IVar3;
    }
    sleeplock(this);
    FVar2 = (this->state)._M_i;
    if (FVar2 != CREATED) break;
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
  }
  if (FVar2 == ERRORED) {
    IVar3 = ERROR_RESULT;
  }
  else if (FVar2 == FINISHED) {
    IVar3 = HALTED;
  }
  else {
    IVar3 = NEXT_STEP;
  }
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return IVar3;
}

Assistant:

IterationResult FederateState::enterInitializingMode(IterationRequest request)
{
    if (try_lock()) {  // only enter this loop once per federate
        auto ret = processQueue();
        unlock();
        initIterating = false;
        switch (ret) {
            case MessageProcessingResult::NEXT_STEP:
                time_granted = initialTime;
                allowed_send_time = initialTime;
                break;
            case MessageProcessingResult::ITERATING:
            default:
                break;
        }
        return static_cast<IterationResult>(ret);
    }
    // this function can handle try_lock fail gracefully
    sleeplock();
    IterationResult ret;
    switch (getState()) {
        case FederateStates::ERRORED:
            ret = IterationResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = IterationResult::HALTED;
            break;
        case FederateStates::CREATED:
            unlock();
            return enterInitializingMode(request);
        default:  // everything >= INITIALIZING
            ret = IterationResult::NEXT_STEP;
            break;
    }
    unlock();
    return ret;
}